

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O3

compile_errcode __thiscall InputStatement::Action(InputStatement *this)

{
  int iVar1;
  int line_number;
  int character_number;
  pointer pSVar2;
  SymbolName SVar3;
  undefined4 uVar4;
  string identifier_name;
  string local_50;
  
  uVar4 = 0;
  do {
    SVar3 = SymbolQueue::GetCurrentName(handle_correct_queue);
    switch(uVar4) {
    case 0:
      uVar4 = 1;
      if (SVar3 != SCANF_SYM) {
        return -1;
      }
      break;
    case 1:
      uVar4 = 2;
      if (SVar3 != L_CIRCLE_BRACKET_SYM) {
        return -1;
      }
      break;
    case 2:
      if (SVar3 != IDENTIFIER_SYM) {
        return -1;
      }
      iVar1 = handle_correct_queue->m_current_locate;
      pSVar2 = (handle_correct_queue->m_symbol_queue).
               super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
               _M_start;
      line_number = pSVar2[iVar1].m_line_number;
      character_number = pSVar2[iVar1].m_character_number;
      c0_compile::SymbolValue::GetValue<std::__cxx11::string>(&local_50,&pSVar2[iVar1].m_value);
      IdentifierCheck(&local_50,line_number,character_number);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar4 = 3;
      break;
    case 3:
      uVar4 = 2;
      if (SVar3 != COMMA_SYM) {
        if (SVar3 != R_CIRCLE_BRACKET_SYM) {
          return -1;
        }
        uVar4 = 4;
      }
      break;
    case 4:
      return 0;
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
  } while( true );
}

Assistant:

compile_errcode InputStatement::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (name == SCANF_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == IDENTIFIER_SYM) {
                    string identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    IdentifierCheck(identifier_name, line_number, character_number);
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == COMMA_SYM) {
                    state = 2;
                    break;
                } else if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 4: return COMPILE_OK;
        }
        handle_correct_queue->NextSymbol();
    }
}